

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O1

json_string * __thiscall
JSONNode::write_formatted_abi_cxx11_
          (json_string *__return_storage_ptr__,JSONNode *this,size_t approxsize)

{
  pointer pcVar1;
  json_string *pjVar2;
  
  if ((this->internal->_type & 0xfe) == 4) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    internalJSONNode::Write(this->internal,0,true,__return_storage_ptr__);
  }
  else {
    pjVar2 = jsonSingletonEMPTY_JSON_STRING::getValue_abi_cxx11_();
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pjVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pjVar2->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

inline json_string JSONNode::write_formatted(size_t approxsize) const json_nothrow {
	    JSON_CHECK_INTERNAL();
	    JSON_ASSERT_SAFE(type() == JSON_NODE || type() == JSON_ARRAY, JSON_TEXT("Writing a non-writable node"), return json_global(EMPTY_JSON_STRING););
		json_string result;
		result.reserve(approxsize);
		internal -> Write(0, true, result);
		return result;
    }